

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional-main.t.hpp
# Opt level: O2

ostream * lest::operator<<(ostream *os,optional<long> *v)

{
  ostream *poVar1;
  long *value;
  allocator<char> local_39;
  string local_38;
  
  poVar1 = std::operator<<(os,"[optional:");
  if ((v->super__Optional_base<long,_true,_true>)._M_payload.super__Optional_payload_base<long>.
      _M_engaged == true) {
    string_maker<long>::to_string_abi_cxx11_(&local_38,(string_maker<long> *)v,value);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"[empty]",&local_39);
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::optional<T> const & v )
{
    using lest::to_string;
    return os << "[optional:" << (v ? to_string(*v) : "[empty]") << "]";
}